

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::CopyAELToSEL(Clipper *this)

{
  TEdge *pTVar1;
  
  pTVar1 = *(TEdge **)
            (this->_vptr_Clipper[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  this->m_SortedEdges = pTVar1;
  while (pTVar1 != (TEdge *)0x0) {
    pTVar1->PrevInSEL = pTVar1->PrevInAEL;
    pTVar1->NextInSEL = pTVar1->NextInAEL;
    pTVar1 = pTVar1->NextInAEL;
  }
  return;
}

Assistant:

void Clipper::CopyAELToSEL()
{
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  while ( e )
  {
    e->PrevInSEL = e->PrevInAEL;
    e->NextInSEL = e->NextInAEL;
    e = e->NextInAEL;
  }
}